

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::expression
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,
          vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *code,int pcStart)

{
  pointer pTVar1;
  size_type sVar2;
  _Elt_pointer pSVar3;
  stack<OpenMD::SelectionSet,_std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>_>
  stack;
  SelectionSet bs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Token instruction;
  SelectionSet local_60;
  vector<int,_std::allocator<int>_> bsSize;
  
  createSelectionSets(&bs,this);
  std::
  stack<OpenMD::SelectionSet,std::deque<OpenMD::SelectionSet,std::allocator<OpenMD::SelectionSet>>>
  ::stack<std::deque<OpenMD::SelectionSet,std::allocator<OpenMD::SelectionSet>>,void>(&stack);
  SelectionSet::size(&bsSize,&bs);
  do {
    pTVar1 = (code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(code->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x18) <=
        (ulong)(uint)pcStart) {
      sVar2 = std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::size
                        (&stack.c);
      if (sVar2 != 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"atom expression compiler error - stack over/underflow",
                   (allocator<char> *)&instruction);
        evalError(this,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
      }
      if (stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur =
             stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
                (&__return_storage_ptr__->bitsets_,
                 &stack.c.
                  super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_cur[-1].bitsets_);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&bsSize.super__Vector_base<int,_std::allocator<int>_>);
      std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::~deque(&stack.c);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&bs.bitsets_);
      return __return_storage_ptr__;
    }
    Token::Token(&instruction,pTVar1 + (uint)pcStart);
    switch(instruction.tok) {
    case 0x403:
      pSVar3 = stack.c.
               super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar3 = stack.c.
                 super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                (&bs.bitsets_,&pSVar3[-1].bitsets_);
      std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::pop_back(&stack.c);
      pSVar3 = stack.c.
               super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar3 = stack.c.
                 super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      SelectionSet::andOperator(pSVar3 + -1,&bs);
      break;
    case 0x404:
      pSVar3 = stack.c.
               super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar3 = stack.c.
                 super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
                (&bs.bitsets_,&pSVar3[-1].bitsets_);
      std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::pop_back(&stack.c);
      pSVar3 = stack.c.
               super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar3 = stack.c.
                 super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      SelectionSet::orOperator(pSVar3 + -1,&bs);
      break;
    case 0x405:
      pSVar3 = stack.c.
               super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur ==
          stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar3 = stack.c.
                 super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      SelectionSet::flip(pSVar3 + -1);
      break;
    case 0x406:
    case 0x407:
    case 0x408:
switchD_0022156f_caseD_406:
      unrecognizedExpression(this);
      break;
    case 0x409:
      allInstruction((SelectionSet *)&local_a8,this);
      goto LAB_00221655;
    case 0x40a:
      createSelectionSets((SelectionSet *)&local_a8,this);
LAB_00221655:
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
                (&bs.bitsets_,&local_a8);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_a8);
      std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::push_back
                (&stack.c,&bs);
      break;
    case 0x40b:
      std::any_cast<std::__cxx11::string>(&local_a8,&instruction.value);
      NameFinder::match(&local_60,&this->nameFinder,&local_a8);
      std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
      emplace_back<OpenMD::SelectionSet>(&stack.c,&local_60);
LAB_002217c2:
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_60.bitsets_);
      std::__cxx11::string::~string((string *)&local_a8);
      break;
    default:
      if (instruction.tok - 0x3400U < 6) {
        comparatorInstruction((SelectionSet *)&local_a8,this,&instruction);
        std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
        emplace_back<OpenMD::SelectionSet>(&stack.c,(SelectionSet *)&local_a8);
LAB_002215ee:
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_a8)
        ;
      }
      else if (1 < instruction.tok - 0x464U) {
        if (instruction.tok == 1) {
          std::any_cast<std::__cxx11::string>(&local_a8,&instruction.value);
          lookupValue(&local_60,this,&local_a8);
          std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
          emplace_back<OpenMD::SelectionSet>(&stack.c,&local_60);
          goto LAB_002217c2;
        }
        if (instruction.tok != 0x1406) {
          if (instruction.tok == 0x140c) {
            hull((SelectionSet *)&local_a8,this);
            std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
            emplace_back<OpenMD::SelectionSet>(&stack.c,(SelectionSet *)&local_a8);
          }
          else if (instruction.tok == 0x140d) {
            alphaHullInstruction((SelectionSet *)&local_a8,this,&instruction);
            std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
            emplace_back<OpenMD::SelectionSet>(&stack.c,(SelectionSet *)&local_a8);
          }
          else {
            if (instruction.tok != 0x10400) goto switchD_0022156f_caseD_406;
            indexInstruction((SelectionSet *)&local_a8,this,&instruction.value);
            std::deque<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::
            emplace_back<OpenMD::SelectionSet>(&stack.c,(SelectionSet *)&local_a8);
          }
          goto LAB_002215ee;
        }
        pSVar3 = stack.c.
                 super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            stack.c.super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          pSVar3 = stack.c.
                   super__Deque_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        withinInstruction(this,&instruction,pSVar3 + -1);
      }
    }
    std::any::reset(&instruction.value);
    pcStart = pcStart + 1;
  } while( true );
}

Assistant:

SelectionSet SelectionEvaluator::expression(const std::vector<Token>& code,
                                              int pcStart) {
    SelectionSet bs = createSelectionSets();
    std::stack<SelectionSet> stack;
    vector<int> bsSize = bs.size();

    for (unsigned int pc = pcStart; pc < code.size(); ++pc) {
      Token instruction = code[pc];

      switch (instruction.tok) {
      case Token::expressionBegin:
        break;
      case Token::expressionEnd:
        break;
      case Token::all:
        bs = allInstruction();
        stack.push(bs);
        break;
      case Token::none:
        bs = createSelectionSets();
        stack.push(bs);
        break;
      case Token::opOr:
        bs = stack.top();
        stack.pop();
        stack.top() |= bs;
        break;
      case Token::opAnd:
        bs = stack.top();
        stack.pop();
        stack.top() &= bs;
        break;
      case Token::opNot:
        stack.top().flip();
        break;
      case Token::within:
        withinInstruction(instruction, stack.top());
        break;
      case Token::alphahull:
        stack.push(alphaHullInstruction(instruction));
        break;
      case Token::hull:
        stack.push(hull());
        break;
        // case Token::selected:
        //  stack.push(getSelectionSet());
        //  break;
      case Token::name:
        stack.push(
            nameInstruction(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::index:
        stack.push(indexInstruction(instruction.value));
        break;
      case Token::identifier:
        stack.push(lookupValue(std::any_cast<std::string>(instruction.value)));
        break;
      case Token::opLT:
      case Token::opLE:
      case Token::opGE:
      case Token::opGT:
      case Token::opEQ:
      case Token::opNE:
        stack.push(comparatorInstruction(instruction));
        break;
      default:
        unrecognizedExpression();
      }
    }
    if (stack.size() != 1)
      evalError("atom expression compiler error - stack over/underflow");

    return stack.top();
  }